

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.h
# Opt level: O2

void __thiscall
draco::PointCloud::AddAttributeMetadata
          (PointCloud *this,int32_t att_id,
          unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          *metadata)

{
  GeometryMetadata *pGVar1;
  pointer __p;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_40;
  __uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> local_38;
  
  pGVar1 = (this->metadata_)._M_t.
           super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
           .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if (pGVar1 == (GeometryMetadata *)0x0) {
    pGVar1 = (GeometryMetadata *)operator_new(0x78);
    GeometryMetadata::GeometryMetadata(pGVar1);
    local_38._M_t.
    super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
    .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
         (tuple<draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>)
         (_Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
         )0x0;
    std::__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    reset((__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *
          )&this->metadata_,pGVar1);
    std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    ~unique_ptr((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                 *)&local_38);
    pGVar1 = (this->metadata_)._M_t.
             super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
             .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  }
  local_40._M_head_impl =
       (metadata->_M_t).
       super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
       ._M_t.
       super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
       .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
  (local_40._M_head_impl)->att_unique_id_ =
       *(uint32_t *)
        ((long)(this->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[att_id]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t + 0x3c);
  (metadata->_M_t).
  super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>.
  _M_t.
  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl = (AttributeMetadata *)0x0;
  GeometryMetadata::AddAttributeMetadata
            (pGVar1,(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                     *)&local_40);
  std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
  ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               *)&local_40);
  return;
}

Assistant:

void AddAttributeMetadata(int32_t att_id,
                            std::unique_ptr<AttributeMetadata> metadata) {
    if (!metadata_) {
      metadata_ = std::unique_ptr<GeometryMetadata>(new GeometryMetadata());
    }
    const int32_t att_unique_id = attribute(att_id)->unique_id();
    metadata->set_att_unique_id(att_unique_id);
    metadata_->AddAttributeMetadata(std::move(metadata));
  }